

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

void __thiscall
fasttext::DenseMatrix::addVectorToRow(DenseMatrix *this,Vector *vec,int64_t i,real a)

{
  pointer pfVar1;
  pointer pfVar2;
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  undefined1 in_register_00001204 [12];
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x7b,
                  "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)"
                 );
  }
  if (i < (this->super_Matrix).m_) {
    pfVar1 = (vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar1 >> 2;
    if (lVar4 == (this->super_Matrix).n_) {
      if (0 < lVar4) {
        lVar5 = 0;
        pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          auVar3._4_12_ = in_register_00001204;
          auVar3._0_4_ = a;
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)pfVar1[lVar5]),auVar3,
                                   ZEXT416((uint)pfVar2[i * lVar4 + lVar5]));
          pfVar2[i * lVar4 + lVar5] = auVar3._0_4_;
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      return;
    }
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x7d,
                  "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)"
                 );
  }
  __assert_fail("i < m_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                ,0x7c,
                "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)")
  ;
}

Assistant:

void DenseMatrix::addVectorToRow(const Vector& vec, int64_t i, real a) {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  for (int64_t j = 0; j < n_; j++) {
    data_[i * n_ + j] += a * vec[j];
  }
}